

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall
CRenderTools::MapScreenToGroup
          (CRenderTools *this,float CenterX,float CenterY,CMapItemGroup *pGroup,float Zoom)

{
  long lVar1;
  IGraphics *pIVar2;
  CRenderTools *in_RSI;
  CRenderTools *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar3;
  float Zoom_00;
  float Aspect;
  float OffsetY;
  undefined4 in_XMM1_Da;
  float in_XMM2_Da;
  float aPoints [4];
  float in_stack_ffffffffffffffc8;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fVar3 = (float)*(int *)((long)&in_RSI->m_pGraphics + 4) / 100.0;
  Zoom_00 = (float)*(int *)&in_RSI[1].m_pConfig / 100.0;
  Aspect = (float)*(int *)((long)&in_RSI->m_pConfig + 4);
  OffsetY = (float)*(int *)&in_RSI->m_pGraphics;
  Graphics(in_RDI);
  IGraphics::ScreenAspect((IGraphics *)CONCAT44(Aspect,Zoom_00));
  MapScreenToWorld(in_RSI,in_XMM2_Da,in_stack_ffffffffffffffc8,(float)((ulong)in_RDI >> 0x20),
                   SUB84(in_RDI,0),in_XMM0_Da,OffsetY,Aspect,Zoom_00,
                   (float *)CONCAT44(fVar3,in_XMM1_Da));
  pIVar2 = Graphics(in_RDI);
  (*(pIVar2->super_IInterface)._vptr_IInterface[5])(local_18,local_14,local_10,local_c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::MapScreenToGroup(float CenterX, float CenterY, const CMapItemGroup *pGroup, float Zoom)
{
	float aPoints[4];
	MapScreenToWorld(CenterX, CenterY, pGroup->m_ParallaxX/100.0f, pGroup->m_ParallaxY/100.0f,
		pGroup->m_OffsetX, pGroup->m_OffsetY, Graphics()->ScreenAspect(), Zoom, aPoints);
	Graphics()->MapScreen(aPoints[0], aPoints[1], aPoints[2], aPoints[3]);
}